

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::double_writer>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *this,
          size_t size,align_spec *spec,double_writer f)

{
  byte bVar1;
  undefined8 *puVar2;
  long lVar3;
  size_t size_1;
  char *__s;
  char *__dest;
  char __tmp;
  basic_buffer<char> *c;
  ulong uVar4;
  unsigned_long __n2;
  size_t __len;
  size_t __n;
  ulong uVar5;
  
  uVar5 = (ulong)spec->width_;
  puVar2 = *(undefined8 **)this;
  lVar3 = puVar2[2];
  __n = uVar5 - size;
  if (uVar5 < size || __n == 0) {
    uVar5 = size + lVar3;
    if ((ulong)puVar2[3] < uVar5) {
      (**(code **)*puVar2)(puVar2,uVar5);
    }
    puVar2[2] = uVar5;
    __dest = (char *)(lVar3 + puVar2[1]);
LAB_0011db0d:
    if (f.sign != '\0') {
      *__dest = f.sign;
      __dest = __dest + 1;
      f.n = f.n - 1;
    }
    if (f.n == 0) {
      return;
    }
    memmove(__dest,((f.buffer)->super_basic_buffer<char>).ptr_,f.n);
    return;
  }
  uVar4 = lVar3 + uVar5;
  if ((ulong)puVar2[3] < uVar4) {
    (**(code **)*puVar2)(puVar2,uVar4);
  }
  puVar2[2] = uVar4;
  __s = (char *)(lVar3 + puVar2[1]);
  bVar1 = (byte)spec->fill_;
  if (spec->align_ == ALIGN_CENTER) {
    uVar4 = __n >> 1;
    if (1 < __n) {
      memset(__s,(uint)bVar1,uVar4);
      __s = __s + uVar4;
    }
    if (f.sign != '\0') {
      *__s = f.sign;
      __s = __s + 1;
      f.n = f.n - 1;
    }
    if (f.n != 0) {
      memmove(__s,((f.buffer)->super_basic_buffer<char>).ptr_,f.n);
      __s = __s + f.n;
    }
    if (uVar5 == size) {
      return;
    }
    __n = __n - uVar4;
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      __dest = __s;
      if (uVar5 != size) {
        __dest = __s + __n;
        memset(__s,(uint)bVar1,__n);
      }
      goto LAB_0011db0d;
    }
    if (f.sign != '\0') {
      *__s = f.sign;
      __s = __s + 1;
      f.n = f.n - 1;
    }
    if (f.n != 0) {
      memmove(__s,((f.buffer)->super_basic_buffer<char>).ptr_,f.n);
      __s = __s + f.n;
    }
    if (uVar5 == size) {
      return;
    }
  }
  memset(__s,(uint)bVar1,__n);
  return;
}

Assistant:

void basic_writer<Range>::write_padded(
    std::size_t size, const align_spec &spec, F f) {
  unsigned width = spec.width();
  if (width <= size)
    return f(reserve(size));
  auto &&it = reserve(width);
  char_type fill = static_cast<char_type>(spec.fill());
  std::size_t padding = width - size;
  if (spec.align() == ALIGN_RIGHT) {
    it = std::fill_n(it, padding, fill);
    f(it);
  } else if (spec.align() == ALIGN_CENTER) {
    std::size_t left_padding = padding / 2;
    it = std::fill_n(it, left_padding, fill);
    f(it);
    it = std::fill_n(it, padding - left_padding, fill);
  } else {
    f(it);
    it = std::fill_n(it, padding, fill);
  }
}